

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::compile_unary_expression
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_unary_expression_t *expr)

{
  unary_operator_t op;
  instruction_t iVar1;
  typed_expression_t *ptVar2;
  ulong local_20;
  typed_unary_expression_t *local_18;
  typed_unary_expression_t *expr_local;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  local_18 = expr;
  expr_local = (typed_unary_expression_t *)this;
  ptVar2 = typed_unary_expression_t::operand(expr);
  (**(code **)(*(long *)ptVar2 + 0x30))(ptVar2,this);
  op = unary_expression_t::unary_operator(&local_18->super_unary_expression_t);
  iVar1 = operator_to_instruction(this,op);
  local_20 = (ulong)iVar1;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,(value_type_conflict3 *)&local_20);
  return;
}

Assistant:

void compile_unary_expression(tchecker::typed_unary_expression_t const & expr)
  {
    expr.operand().visit(*this);
    _bytecode_back_inserter = operator_to_instruction(expr.unary_operator());
  }